

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O1

int Gia_ManSeqMarkUsed_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = 0;
  while( true ) {
    while( true ) {
      uVar1 = *(ulong *)pObj;
      uVar5 = (uint)uVar1;
      if ((uVar5 >> 0x1e & 1) == 0) {
        return iVar7;
      }
      *(ulong *)pObj = uVar1 & 0xffffffffbfffffff;
      uVar2 = uVar5 & 0x1fffffff;
      if ((-1 < (int)uVar5) || (uVar2 == 0x1fffffff)) break;
      pObj = pObj + -(ulong)uVar2;
    }
    if (((uVar5 & 0x9fffffff) == 0x9fffffff) &&
       (uVar6 = (uint)(uVar1 >> 0x20), p->vCis->nSize - p->nRegs <= (int)(uVar6 & 0x1fffffff)))
    break;
    if (((int)uVar5 < 0) || (uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScl.c"
                    ,0x8c,"int Gia_ManSeqMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    iVar3 = Gia_ManSeqMarkUsed_rec(p,pObj + -(ulong)uVar2,vRoots);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    iVar7 = iVar7 + iVar3 + 1;
  }
  uVar6 = uVar6 & 0x1fffffff;
  iVar3 = p->vCis->nSize;
  if ((int)uVar6 < iVar3 - p->nRegs) {
    __assert_fail("Gia_ObjIsRo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar8 = p->vCos->nSize;
  uVar6 = (iVar8 - iVar3) + uVar6;
  if (((int)uVar6 < 0) || (iVar8 <= (int)uVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = p->vCos->pArray[uVar6];
  if ((iVar3 < 0) || (p->nObjs <= iVar3)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar5 = vRoots->nCap;
  if (vRoots->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vRoots->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(0x40);
      }
      else {
        piVar4 = (int *)realloc(vRoots->pArray,0x40);
      }
      vRoots->pArray = piVar4;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar5 * 2;
      if (iVar8 <= (int)uVar5) goto LAB_0070ec69;
      if (vRoots->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((ulong)uVar5 << 3);
      }
      else {
        piVar4 = (int *)realloc(vRoots->pArray,(ulong)uVar5 << 3);
      }
      vRoots->pArray = piVar4;
    }
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vRoots->nCap = iVar8;
  }
LAB_0070ec69:
  iVar8 = vRoots->nSize;
  vRoots->nSize = iVar8 + 1;
  vRoots->pArray[iVar8] = iVar3;
  return iVar7;
}

Assistant:

int Gia_ManSeqMarkUsed_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots )
{
    if ( !pObj->fMark0 )
        return 0;
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots );
    if ( Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
        return 0;
    }
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots )
             + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin1(pObj), vRoots );
}